

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

cmLinkInterface * __thiscall
cmGeneratorTarget::GetLinkInterface
          (cmGeneratorTarget *this,string *config,cmGeneratorTarget *head,bool secondPass)

{
  _Base_ptr p_Var1;
  bool bVar2;
  TargetType TVar3;
  cmLinkInterface *pcVar4;
  map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
  *this_00;
  cmLinkInterface *pcVar5;
  cmGeneratorTarget *head_local;
  cmLinkInterface local_120;
  
  head_local = head;
  bVar2 = IsImported(this);
  if (bVar2) {
    pcVar4 = GetImportLinkInterface(this,config,head,Link,secondPass);
    return pcVar4;
  }
  TVar3 = GetType(this);
  if ((TVar3 == EXECUTABLE) && (bVar2 = IsExecutableWithExports(this), !bVar2)) {
    return (cmLinkInterface *)0x0;
  }
  this_00 = &GetHeadToLinkInterfaceMap(this,config)->
             super_map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
  ;
  if (((this_00->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) &&
     (p_Var1 = (this_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
     *(char *)&p_Var1[4]._M_parent == '\0')) {
    head_local = *(cmGeneratorTarget **)(p_Var1 + 1);
  }
  pcVar4 = &std::
            map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
            ::operator[](this_00,&head_local)->super_cmLinkInterface;
  if (secondPass) {
    memset(&local_120,0,0xf8);
    cmOptionalLinkInterface::cmOptionalLinkInterface((cmOptionalLinkInterface *)&local_120);
    cmOptionalLinkInterface::operator=
              ((cmOptionalLinkInterface *)pcVar4,(cmOptionalLinkInterface *)&local_120);
    cmLinkInterface::~cmLinkInterface(&local_120);
  }
  if (pcVar4->field_0xf2 == '\0') {
    pcVar4->field_0xf2 = 1;
    ComputeLinkInterfaceLibraries(this,config,(cmOptionalLinkInterface *)pcVar4,head_local,Link);
  }
  if ((pcVar4->field_0xf3 == '\0') && (pcVar4->field_0xf3 = 1, pcVar4->field_0xf4 == '\x01')) {
    ComputeLinkInterface(this,config,(cmOptionalLinkInterface *)pcVar4,head_local,secondPass);
    ComputeLinkInterfaceRuntimeLibraries(this,config,(cmOptionalLinkInterface *)pcVar4);
  }
  pcVar5 = (cmLinkInterface *)0x0;
  if (pcVar4->field_0xf4 != '\0') {
    pcVar5 = pcVar4;
  }
  return pcVar5;
}

Assistant:

cmLinkInterface const* cmGeneratorTarget::GetLinkInterface(
  const std::string& config, cmGeneratorTarget const* head,
  bool secondPass) const
{
  // Imported targets have their own link interface.
  if (this->IsImported()) {
    return this->GetImportLinkInterface(config, head, LinkInterfaceFor::Link,
                                        secondPass);
  }

  // Link interfaces are not supported for executables that do not
  // export symbols.
  if (this->GetType() == cmStateEnums::EXECUTABLE &&
      !this->IsExecutableWithExports()) {
    return nullptr;
  }

  // Lookup any existing link interface for this configuration.
  cmHeadToLinkInterfaceMap& hm = this->GetHeadToLinkInterfaceMap(config);

  // If the link interface does not depend on the head target
  // then re-use the one from the head we computed first.
  if (!hm.empty() && !hm.begin()->second.HadHeadSensitiveCondition) {
    head = hm.begin()->first;
  }

  cmOptionalLinkInterface& iface = hm[head];
  if (secondPass) {
    iface = cmOptionalLinkInterface();
  }
  if (!iface.LibrariesDone) {
    iface.LibrariesDone = true;
    this->ComputeLinkInterfaceLibraries(config, iface, head,
                                        LinkInterfaceFor::Link);
  }
  if (!iface.AllDone) {
    iface.AllDone = true;
    if (iface.Exists) {
      this->ComputeLinkInterface(config, iface, head, secondPass);
      this->ComputeLinkInterfaceRuntimeLibraries(config, iface);
    }
  }

  return iface.Exists ? &iface : nullptr;
}